

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::StreamArchive::get_hash_list_for_resource_tag
          (StreamArchive *this,ResourceTag tag,size_t *hash_count,Hash *hashes)

{
  ExportedMetadataHeader *pEVar1;
  size_t sVar2;
  Hash *pHVar3;
  size_t sVar4;
  __node_base *p_Var5;
  
  pEVar1 = this->imported_metadata;
  if (pEVar1 == (ExportedMetadataHeader *)0x0) {
    sVar2 = this->seen_blobs[tag]._M_h._M_element_count;
    if (hashes == (Hash *)0x0) {
      *hash_count = sVar2;
    }
    else {
      if (sVar2 != *hash_count) {
        return false;
      }
      p_Var5 = &this->seen_blobs[tag]._M_h._M_before_begin;
      pHVar3 = hashes;
      while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
        *pHVar3 = (Hash)p_Var5[1]._M_nxt;
        pHVar3 = pHVar3 + 1;
      }
      std::__sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(hashes,hashes + sVar2);
    }
  }
  else {
    sVar2 = pEVar1->lists[tag].count;
    if (hashes == (Hash *)0x0) {
      *hash_count = sVar2;
    }
    else {
      if (sVar2 != *hash_count) {
        return false;
      }
      pHVar3 = (Hash *)((long)&((ExportedMetadataHeader *)(pEVar1->lists + -1))->magic +
                       pEVar1->lists[tag].offset);
      for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
        hashes[sVar4] = *pHVar3;
        pHVar3 = pHVar3 + 4;
      }
    }
  }
  return true;
}

Assistant:

bool get_hash_list_for_resource_tag(ResourceTag tag, size_t *hash_count, Hash *hashes) override
	{
		if (imported_metadata)
		{
			size_t size = imported_metadata->lists[tag].count;
			if (hashes)
			{
				if (size != *hash_count)
					return false;
			}
			else
				*hash_count = size;

			if (hashes)
			{
				const auto *blocks = reinterpret_cast<const ExportedMetadataBlock *>(
						reinterpret_cast<const uint8_t *>(imported_metadata) + imported_metadata->lists[tag].offset);
				for (size_t i = 0; i < size; i++)
					hashes[i] = blocks[i].hash;
			}
		}
		else
		{
			size_t size = seen_blobs[tag].size();
			if (hashes)
			{
				if (size != *hash_count)
					return false;
			}
			else
				*hash_count = size;

			if (hashes)
			{
				Hash *iter = hashes;
				for (auto &blob : seen_blobs[tag])
					*iter++ = blob.first;

				// Make replay more deterministic.
				sort(hashes, hashes + size);
			}
		}

		return true;
	}